

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

MicroRep * __thiscall
google::protobuf::internal::MicroString::AllocateMicroRep
          (MicroString *this,size_t size,Arena *arena)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  LogMessage *pLVar4;
  LogMessage local_78;
  Voidify local_61;
  void *local_60;
  void *alloc_1;
  undefined1 local_50 [8];
  SizedPtr alloc;
  size_t capacity;
  MicroRep *h;
  Arena *arena_local;
  size_t size_local;
  MicroString *this_local;
  
  if (arena == (Arena *)0x0) {
    alloc.n = size;
    sVar2 = MicroRepSize(size);
    _local_50 = AllocateAtLeast(sVar2 + 7 & 0xfffffffffffffff8);
    alloc_1 = (void *)((long)alloc.p + -2);
    puVar3 = std::min<unsigned_long>(&kMaxMicroRepCapacity,(unsigned_long *)&alloc_1);
    alloc.n = *puVar3;
    capacity = (size_t)local_50;
  }
  else {
    alloc.n = (size + 9 & 0xfffffffffffffff8) - 2;
    puVar3 = std::min<unsigned_long>(&kMaxMicroRepCapacity,&alloc.n);
    alloc.n = *puVar3;
    sVar2 = MicroRepSize(alloc.n);
    local_60 = Arena::AllocateAligned(arena,sVar2,8);
    capacity = (size_t)local_60;
  }
  *(char *)(capacity + 1) = (char)alloc.n;
  MicroRep::SetInitialSize((MicroRep *)capacity,(uint8_t)size);
  this->rep_ = (void *)(capacity + 2);
  bVar1 = is_micro_rep(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return (MicroRep *)capacity;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
             ,0x74,"is_micro_rep()");
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

MicroString::MicroRep* MicroString::AllocateMicroRep(size_t size,
                                                     Arena* arena) {
  MicroRep* h;
  size_t capacity = size;
  if (arena == nullptr) {
    const internal::SizedPtr alloc = internal::AllocateAtLeast(
        ArenaAlignDefault::Ceil(MicroRepSize(capacity)));
    // Maybe we rounded up too much.
    capacity = std::min(kMaxMicroRepCapacity, alloc.n - sizeof(MicroRep));
    h = reinterpret_cast<MicroRep*>(alloc.p);
  } else {
    capacity =
        ArenaAlignDefault::Ceil(capacity + sizeof(MicroRep)) - sizeof(MicroRep);
    capacity = std::min(kMaxMicroRepCapacity, capacity);
    auto* alloc = arena->AllocateAligned(MicroRepSize(capacity));
    h = reinterpret_cast<MicroRep*>(alloc);
  }
  h->capacity = capacity;
  h->SetInitialSize(size);

  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) + kIsMicroRepTag);
  ABSL_DCHECK(is_micro_rep());

  return h;
}